

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O3

Ivy_Obj_t * Ivy_Mux(Ivy_Man_t *p,Ivy_Obj_t *pC,Ivy_Obj_t *p1,Ivy_Obj_t *p0)

{
  int *piVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *p0_00;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  int iVar7;
  int *piVar8;
  Ivy_Obj_t *p1_00;
  Ivy_Obj_t *pIVar9;
  int *piVar10;
  
  pIVar9 = (Ivy_Obj_t *)((ulong)p1 ^ 1);
  if (pIVar9 == p0) {
    pIVar9 = Ivy_Exor(p,pC,p0);
    return pIVar9;
  }
  piVar10 = (int *)((ulong)pC & 0xfffffffffffffffe);
  if (*piVar10 == 0) {
LAB_007e61b0:
    __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                  ,0x137,
                  "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                 );
  }
  if (p1 == (Ivy_Obj_t *)0x0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)((ulong)p1 & 0xfffffffffffffffe);
    if (*piVar1 == 0) goto LAB_007e6061;
  }
  if (piVar10 != piVar1) {
    *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
    (p->Ghost).pFanin0 = pC;
    (p->Ghost).pFanin1 = p1;
    if (p1 != (Ivy_Obj_t *)0x0) {
      if (pC == (Ivy_Obj_t *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = *piVar10;
      }
      if (*piVar1 < iVar7) {
        (p->Ghost).pFanin0 = p1;
        (p->Ghost).pFanin1 = pC;
      }
    }
    pIVar6 = &p->Ghost;
    pIVar2 = Ivy_TableLookup(p,pIVar6);
    if (*piVar10 == 0) goto LAB_007e61b0;
    if (p0 == (Ivy_Obj_t *)0x0) {
      piVar1 = (int *)0x0;
    }
    else {
      piVar1 = (int *)((ulong)p0 & 0xfffffffffffffffe);
      if (*piVar1 == 0) goto LAB_007e6061;
    }
    if (piVar10 == piVar1) goto LAB_007e61cf;
    p0_00 = (Ivy_Obj_t *)((ulong)pC ^ 1);
    *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
    (p->Ghost).pFanin0 = p0_00;
    (p->Ghost).pFanin1 = p0;
    if (p0 != (Ivy_Obj_t *)0x0) {
      if (pC == (Ivy_Obj_t *)0x1) {
        iVar7 = 0;
      }
      else {
        iVar7 = *piVar10;
      }
      if (*piVar1 < iVar7) {
        (p->Ghost).pFanin0 = p0;
        (p->Ghost).pFanin1 = p0_00;
      }
    }
    pIVar3 = Ivy_TableLookup(p,pIVar6);
    if (pIVar3 != (Ivy_Obj_t *)0x0 && pIVar2 != (Ivy_Obj_t *)0x0) {
      piVar1 = (int *)((ulong)pIVar2 & 0xfffffffffffffffe);
      if (*piVar1 == 0) goto LAB_007e61b0;
      if (pIVar3 == (Ivy_Obj_t *)0x1) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)((ulong)pIVar3 & 0xfffffffffffffffe);
        if (*piVar8 == 0) goto LAB_007e6061;
      }
      if (piVar1 == piVar8) goto LAB_007e61cf;
      *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
      (p->Ghost).pFanin0 = (Ivy_Obj_t *)((ulong)pIVar2 ^ 1);
      (p->Ghost).pFanin1 = (Ivy_Obj_t *)((ulong)pIVar3 ^ 1);
      if (pIVar3 != (Ivy_Obj_t *)0x1) {
        if (pIVar2 == (Ivy_Obj_t *)0x1) {
          iVar7 = 0;
        }
        else {
          iVar7 = *piVar1;
        }
        if (*piVar8 < iVar7) {
          (p->Ghost).pFanin0 = (Ivy_Obj_t *)((ulong)pIVar3 ^ 1);
          (p->Ghost).pFanin1 = (Ivy_Obj_t *)((ulong)pIVar2 ^ 1);
        }
      }
      pIVar4 = Ivy_TableLookup(p,pIVar6);
      if (pIVar4 != (Ivy_Obj_t *)0x0) goto LAB_007e619d;
    }
    if (*piVar10 == 0) goto LAB_007e61b0;
    if (p1 == (Ivy_Obj_t *)0x1) {
      piVar1 = (int *)0x0;
    }
    else {
      piVar1 = (int *)((ulong)p1 & 0xfffffffffffffffe);
      if (*piVar1 == 0) goto LAB_007e6061;
    }
    if (piVar10 == piVar1) goto LAB_007e61cf;
    *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
    (p->Ghost).pFanin0 = pC;
    (p->Ghost).pFanin1 = pIVar9;
    if (p1 != (Ivy_Obj_t *)0x1) {
      if (pC == (Ivy_Obj_t *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = *piVar10;
      }
      if (*piVar1 < iVar7) {
        (p->Ghost).pFanin0 = pIVar9;
        (p->Ghost).pFanin1 = pC;
      }
    }
    pIVar4 = Ivy_TableLookup(p,pIVar6);
    if (*piVar10 == 0) goto LAB_007e61b0;
    if (p0 == (Ivy_Obj_t *)0x1) {
      piVar1 = (int *)0x0;
    }
    else {
      piVar1 = (int *)((ulong)p0 & 0xfffffffffffffffe);
      if (*piVar1 == 0) goto LAB_007e6061;
    }
    if (piVar10 != piVar1) {
      p1_00 = (Ivy_Obj_t *)((ulong)p0 ^ 1);
      *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
      (p->Ghost).pFanin0 = p0_00;
      (p->Ghost).pFanin1 = p1_00;
      if (p0 != (Ivy_Obj_t *)0x1) {
        if (pC == (Ivy_Obj_t *)0x1) {
          iVar7 = 0;
        }
        else {
          iVar7 = *piVar10;
        }
        if (*piVar1 < iVar7) {
          (p->Ghost).pFanin0 = p1_00;
          (p->Ghost).pFanin1 = p0_00;
        }
      }
      pIVar5 = Ivy_TableLookup(p,pIVar6);
      if (pIVar5 != (Ivy_Obj_t *)0x0 && pIVar4 != (Ivy_Obj_t *)0x0) {
        piVar10 = (int *)((ulong)pIVar4 & 0xfffffffffffffffe);
        if (*piVar10 == 0) goto LAB_007e61b0;
        if (pIVar5 == (Ivy_Obj_t *)0x1) {
          piVar1 = (int *)0x0;
        }
        else {
          piVar1 = (int *)((ulong)pIVar5 & 0xfffffffffffffffe);
          if (*piVar1 == 0) {
LAB_007e6061:
            __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                          ,0x138,
                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                         );
          }
        }
        if (piVar10 == piVar1) goto LAB_007e61cf;
        *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
        (p->Ghost).pFanin0 = (Ivy_Obj_t *)((ulong)pIVar4 ^ 1);
        (p->Ghost).pFanin1 = (Ivy_Obj_t *)((ulong)pIVar5 ^ 1);
        if (pIVar5 != (Ivy_Obj_t *)0x1) {
          if (pIVar4 == (Ivy_Obj_t *)0x1) {
            iVar7 = 0;
          }
          else {
            iVar7 = *piVar10;
          }
          if (*piVar1 < iVar7) {
            (p->Ghost).pFanin0 = (Ivy_Obj_t *)((ulong)pIVar5 ^ 1);
            (p->Ghost).pFanin1 = (Ivy_Obj_t *)((ulong)pIVar4 ^ 1);
          }
        }
        pIVar6 = Ivy_TableLookup(p,pIVar6);
        if (pIVar6 != (Ivy_Obj_t *)0x0) {
          return pIVar6;
        }
      }
      if (((pIVar3 != (Ivy_Obj_t *)0x0) + 1) - (uint)(pIVar2 == (Ivy_Obj_t *)0x0) <
          ((pIVar5 != (Ivy_Obj_t *)0x0) + 1) - (uint)(pIVar4 == (Ivy_Obj_t *)0x0)) {
        if (pIVar4 == (Ivy_Obj_t *)0x0) {
          pIVar4 = Ivy_And(p,pC,pIVar9);
        }
        if (pIVar5 == (Ivy_Obj_t *)0x0) {
          pIVar5 = Ivy_And(p,p0_00,p1_00);
        }
        pIVar9 = Ivy_And(p,(Ivy_Obj_t *)((ulong)pIVar4 ^ 1),(Ivy_Obj_t *)((ulong)pIVar5 ^ 1));
        return pIVar9;
      }
      if (pIVar2 == (Ivy_Obj_t *)0x0) {
        pIVar2 = Ivy_And(p,pC,p1);
      }
      if (pIVar3 == (Ivy_Obj_t *)0x0) {
        pIVar3 = Ivy_And(p,p0_00,p0);
      }
      pIVar4 = Ivy_And(p,(Ivy_Obj_t *)((ulong)pIVar2 ^ 1),(Ivy_Obj_t *)((ulong)pIVar3 ^ 1));
LAB_007e619d:
      return (Ivy_Obj_t *)((ulong)pIVar4 ^ 1);
    }
  }
LAB_007e61cf:
  __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                ,0x139,
                "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
               );
}

Assistant:

Ivy_Obj_t * Ivy_Mux( Ivy_Man_t * p, Ivy_Obj_t * pC, Ivy_Obj_t * p1, Ivy_Obj_t * p0 )
{
    Ivy_Obj_t * pTempA1, * pTempA2, * pTempB1, * pTempB2, * pTemp;
    int Count0, Count1;
    // consider trivial cases
    if ( p0 == Ivy_Not(p1) )
        return Ivy_Exor( p, pC, p0 );
    // other cases can be added
    // implement the first MUX (F = C * x1 + C' * x0)
    pTempA1 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, pC,          p1, IVY_AND, IVY_INIT_NONE) );
    pTempA2 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pC), p0, IVY_AND, IVY_INIT_NONE) );
    if ( pTempA1 && pTempA2 )
    {
        pTemp = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pTempA1), Ivy_Not(pTempA2), IVY_AND, IVY_INIT_NONE) );
        if ( pTemp ) return Ivy_Not(pTemp);
    }
    Count0 = (pTempA1 != NULL) + (pTempA2 != NULL);
    // implement the second MUX (F' = C * x1' + C' * x0')
    pTempB1 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, pC,          Ivy_Not(p1), IVY_AND, IVY_INIT_NONE) );
    pTempB2 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pC), Ivy_Not(p0), IVY_AND, IVY_INIT_NONE) );
    if ( pTempB1 && pTempB2 )
    {
        pTemp = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pTempB1), Ivy_Not(pTempB2), IVY_AND, IVY_INIT_NONE) );
        if ( pTemp ) return pTemp;
    }
    Count1 = (pTempB1 != NULL) + (pTempB2 != NULL);
    // compare and decide which one to implement
    if ( Count0 >= Count1 )
    {
        pTempA1 = pTempA1? pTempA1 : Ivy_And(p, pC,          p1);
        pTempA2 = pTempA2? pTempA2 : Ivy_And(p, Ivy_Not(pC), p0);
        return Ivy_Or( p, pTempA1, pTempA2 );
    }
    pTempB1 = pTempB1? pTempB1 : Ivy_And(p, pC,          Ivy_Not(p1));
    pTempB2 = pTempB2? pTempB2 : Ivy_And(p, Ivy_Not(pC), Ivy_Not(p0));
    return Ivy_Not( Ivy_Or( p, pTempB1, pTempB2 ) );

//    return Ivy_Or( Ivy_And(pC, p1), Ivy_And(Ivy_Not(pC), p0) );
}